

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUSSEImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUSSEImpl<double,_1,_1>::calcPartialsPartials
          (BeagleCPUSSEImpl<double,_1,_1> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  int k;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  uVar6 = (ulong)(this->super_BeagleCPUImpl<double,_1,_1>).kPartialsPaddedStateCount;
  lVar8 = uVar6 - 1;
  for (iVar7 = 0; iVar7 < (this->super_BeagleCPUImpl<double,_1,_1>).kCategoryCount;
      iVar7 = iVar7 + 1) {
    iVar4 = ((this->super_BeagleCPUImpl<double,_1,_1>).kPatternCount * iVar7 + startPattern) *
            (int)uVar6;
    pdVar10 = destP + iVar4;
    for (iVar11 = startPattern; iVar11 < endPattern; iVar11 = iVar11 + 1) {
      iVar9 = (this->super_BeagleCPUImpl<double,_1,_1>).kMatrixSize * iVar7;
      for (iVar5 = 0; iVar1 = (this->super_BeagleCPUImpl<double,_1,_1>).kStateCount, iVar5 < iVar1;
          iVar5 = iVar5 + 1) {
        dVar12 = 0.0;
        dVar13 = 0.0;
        dVar14 = 0.0;
        dVar15 = 0.0;
        for (lVar3 = 0; lVar3 < lVar8; lVar3 = lVar3 + 2) {
          dVar12 = dVar12 + matrices1[iVar9 + lVar3] * partials1[iVar4 + lVar3];
          dVar13 = dVar13 + (matrices1 + iVar9 + lVar3)[1] * (partials1 + iVar4 + lVar3)[1];
          dVar14 = dVar14 + matrices2[iVar9 + lVar3] * partials2[iVar4 + lVar3];
          dVar15 = dVar15 + (matrices2 + iVar9 + lVar3)[1] * (partials2 + iVar4 + lVar3)[1];
        }
        iVar9 = iVar9 + 1 + iVar1;
        *pdVar10 = (dVar12 + dVar13) * (dVar14 + dVar15);
        pdVar10 = pdVar10 + 1;
      }
      *pdVar10 = 0.0;
      pdVar10 = pdVar10 + 1;
      uVar2 = (this->super_BeagleCPUImpl<double,_1,_1>).kPartialsPaddedStateCount;
      uVar6 = (ulong)uVar2;
      iVar4 = iVar4 + uVar2;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_SSE_TEMPLATE
void BeagleCPUSSEImpl<BEAGLE_CPU_SSE_DOUBLE>::calcPartialsPartials(double* __restrict destP,
                                                                   const double* __restrict partials1,
                                                                   const double* __restrict matrices1,
                                                                   const double* __restrict partials2,
                                                                   const double* __restrict matrices2,
                                                                   int startPattern,
                                                                   int endPattern) {
    int stateCountMinusOne = kPartialsPaddedStateCount - 1;
#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
    	int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
    	double* destPu = destP + v;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount;
#ifdef DOUBLE_UNROLL
            		i += 2 // TODO This only works if stateCount is even
#else
            		++i
#endif
            ) {
            	V_Real sum1_vecA = VEC_SETZERO();
            	V_Real sum2_vecA = VEC_SETZERO();
            	for (int j = 0; j < stateCountMinusOne; j += 2) {
            		sum1_vecA = VEC_MADD(
								 VEC_LOAD(matrices1 + w + j),  // TODO This only works if w is even
								 VEC_LOAD(partials1 + v + j),  // TODO This only works if v is even
								 sum1_vecA);
            		sum2_vecA = VEC_MADD(
								 VEC_LOAD(matrices2 + w + j),
								 VEC_LOAD(partials2 + v + j),
								 sum2_vecA);
            	}

            	sum1_vecA = VEC_MULT(
            	               VEC_ADD(sum1_vecA, VEC_SWAP(sum1_vecA)),
            	               VEC_ADD(sum2_vecA, VEC_SWAP(sum2_vecA))
            	           );

                // increment for the extra column at the end
                w += kStateCount + T_PAD;

#ifndef DOUBLE_UNROLL
                // Store single value
                VEC_STORE_SCALAR(destPu, sum1_vecA);
                destPu++;
#endif

#ifdef DOUBLE_UNROLL
            	V_Real sum1_vecB = VEC_SETZERO();
            	V_Real sum2_vecB = VEC_SETZERO();
            	for (int j = 0; j < stateCountMinusOne; j += 2) {
            		sum1_vecB = VEC_MADD(
								 VEC_LOAD(matrices1 + w + j),  // TODO This only works if w is even
								 VEC_LOAD(partials1 + v + j),  // TODO This only works if v is even
								 sum1_vecB);
            		sum2_vecB = VEC_MADD(
								 VEC_LOAD(matrices2 + w + j),
								 VEC_LOAD(partials2 + v + j),
								 sum2_vecB);
            	}

            	sum1_vecB = VEC_MULT(
            	               VEC_ADD(sum1_vecB, VEC_SWAP(sum1_vecB)),
            	               VEC_ADD(sum2_vecB, VEC_SWAP(sum2_vecB))
            	           );

                // increment for the extra column at the end
                w += kStateCount + T_PAD;

                // Store both partials in one transaction
                VEC_STORE(destPu, VEC_MOVE(sum1_vecA, sum1_vecB));
                destPu += 2;
#endif

            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    *(destPu++) = 0.0;
                }
            }
            v += kPartialsPaddedStateCount;
        }
    }
}